

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_status_code_from_enum.hpp
# Opt level: O0

bool __thiscall
system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>::_do_equivalent
          (_quick_status_code_from_enum_domain<another_namespace::AnotherCode> *this,
          status_code<void> *code1,status_code<void> *code2)

{
  value_type vVar1;
  value_type vVar2;
  bool bVar3;
  status_code_domain *psVar4;
  value_type *pvVar5;
  mapping *pmVar6;
  const_iterator peVar7;
  value_type *pvVar8;
  errc ec;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<system_error2::errc> *__range4;
  mapping *mapping;
  generic_code *c2_1;
  quick_status_code_from_enum_code<value_type> *c2;
  quick_status_code_from_enum_code<value_type> *c1;
  status_code<void> *code2_local;
  status_code<void> *code1_local;
  _quick_status_code_from_enum_domain<another_namespace::AnotherCode> *this_local;
  
  psVar4 = status_code<void>::domain(code1);
  bVar3 = status_code_domain::operator==(psVar4,&this->super_status_code_domain);
  if (!bVar3) {
    __assert_fail("code1.domain() == *this",
                  "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/quick_status_code_from_enum.hpp"
                  ,0x8f,
                  "virtual bool system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>::_do_equivalent(const status_code<void> &, const status_code<void> &) const [Enum = another_namespace::AnotherCode]"
                 );
  }
  psVar4 = status_code<void>::domain(code2);
  bVar3 = status_code_domain::operator==(psVar4,&this->super_status_code_domain);
  if (bVar3) {
    pvVar5 = detail::
             status_code_storage<system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>_>
             ::value((status_code_storage<system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>_>
                      *)code1);
    vVar2 = *pvVar5;
    pvVar5 = detail::
             status_code_storage<system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>_>
             ::value((status_code_storage<system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>_>
                      *)code2);
    this_local._7_1_ = vVar2 == *pvVar5;
  }
  else {
    psVar4 = status_code<void>::domain(code2);
    bVar3 = status_code_domain::operator==(psVar4,(status_code_domain *)generic_code_domain);
    if (bVar3) {
      pvVar5 = detail::
               status_code_storage<system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>_>
               ::value((status_code_storage<system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>_>
                        *)code1);
      pmVar6 = _find_mapping(*pvVar5);
      if (pmVar6 == (mapping *)0x0) {
        __assert_fail("mapping != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/quick_status_code_from_enum.hpp"
                      ,0x9b,
                      "virtual bool system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>::_do_equivalent(const status_code<void> &, const status_code<void> &) const [Enum = another_namespace::AnotherCode]"
                     );
      }
      if (pmVar6 != (mapping *)0x0) {
        __end0 = std::initializer_list<system_error2::errc>::begin(&pmVar6->code_mappings);
        peVar7 = std::initializer_list<system_error2::errc>::end(&pmVar6->code_mappings);
        for (; __end0 != peVar7; __end0 = __end0 + 1) {
          vVar1 = *__end0;
          pvVar8 = detail::status_code_storage<system_error2::_generic_code_domain>::value
                             ((status_code_storage<system_error2::_generic_code_domain> *)code2);
          if (vVar1 == *pvVar8) {
            return true;
          }
        }
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool _do_equivalent(const status_code<void> &code1, const status_code<void> &code2) const noexcept override
  {
    assert(code1.domain() == *this);                                                            // NOLINT
    const auto &c1 = static_cast<const quick_status_code_from_enum_code<value_type> &>(code1);  // NOLINT
    if(code2.domain() == *this)
    {
      const auto &c2 = static_cast<const quick_status_code_from_enum_code<value_type> &>(code2);  // NOLINT
      return c1.value() == c2.value();
    }
    if(code2.domain() == generic_code_domain)
    {
      const auto &c2 = static_cast<const generic_code &>(code2);  // NOLINT
      const auto *mapping = _find_mapping(c1.value());
#if SYSTEM_ERROR2_QUICK_STATUS_CODE_FROM_ENUM_ASSERT_ON_MISSING_MAPPING_TABLE_ENTRIES
      assert(mapping != nullptr);  // if this fires, you forgot to add the enum to the mapping table
#endif
      if(mapping != nullptr)
      {
        for(errc ec : mapping->code_mappings)
        {
          if(ec == c2.value())
          {
            return true;
          }
        }
      }
    }
    return false;
  }